

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O1

void __thiscall mathOps_hypot3_Test::TestBody(mathOps_hypot3_Test *this)

{
  precise_measurement *in_R8;
  precise_measurement *val2;
  char *pcVar1;
  AssertionResult gtest_ar_3;
  precise_measurement res2;
  precise_measurement res3;
  precise_measurement res;
  precise_measurement m3;
  precise_measurement m2;
  precise_measurement m1;
  AssertHelper local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  AssertHelper local_b8;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  precise_measurement local_98;
  precise_measurement local_80;
  precise_measurement local_68;
  precise_measurement local_50;
  precise_measurement local_38;
  
  local_38.value_ = 5.0;
  local_38.units_.multiplier_ = (double)0x3ff0000000000000;
  local_38.units_.base_units_ = (unit_data)0x1;
  local_38.units_.commodity_ = 0;
  local_50.value_ = 5.4;
  local_50.units_.multiplier_ = (double)0x3f9a027525460aa6;
  local_50.units_.base_units_ = (unit_data)0x1;
  local_50.units_.commodity_ = 0;
  local_68.value_ = 0.01;
  local_68.units_.multiplier_ = (double)0x408f400000000000;
  local_68.units_.base_units_ = (unit_data)0x1;
  local_68.units_.commodity_ = 0;
  units::
  hypot<units::precise_measurement,units::precise_measurement,units::precise_measurement,void>
            (&local_80,(units *)&local_38,&local_50,&local_68,in_R8);
  testing::internal::CmpHelperGT<units::precise_measurement,units::precise_measurement>
            ((internal *)local_b0,"res","m1",&local_80,&local_38);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xb9,pcVar1);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((long *)local_98.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_98.value_ + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  testing::internal::CmpHelperGT<units::precise_measurement,units::precise_measurement>
            ((internal *)local_b0,"res","m2",&local_80,&local_50);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xba,pcVar1);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((long *)local_98.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_98.value_ + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  val2 = &local_68;
  testing::internal::CmpHelperGT<units::precise_measurement,units::precise_measurement>
            ((internal *)local_b0,"res","m3",&local_80,val2);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      val2 = (precise_measurement *)0x18427d;
    }
    else {
      val2 = (precise_measurement *)(local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xbb,(char *)val2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((long *)local_98.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_98.value_ + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  units::
  hypot<units::precise_measurement,units::precise_measurement,units::precise_measurement,void>
            ((precise_measurement *)local_b0,(units *)&local_68,&local_38,&local_50,val2);
  units::
  hypot<units::precise_measurement,units::precise_measurement,units::precise_measurement,void>
            (&local_98,(units *)&local_50,&local_68,&local_38,val2);
  testing::internal::CmpHelperEQ<units::precise_measurement,units::precise_measurement>
            ((internal *)&local_d0,"res","res2",&local_80,(precise_measurement *)local_b0);
  if (local_d0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xbe,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  testing::internal::CmpHelperEQ<units::precise_measurement,units::precise_measurement>
            ((internal *)&local_d0,"res2","res3",(precise_measurement *)local_b0,&local_98);
  if (local_d0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xbf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  return;
}

Assistant:

TEST(mathOps, hypot3)
{
    precise_measurement m1(5.0, precise::m);
    precise_measurement m2(5.4, precise::in);
    precise_measurement m3(0.01, precise::km);
    auto res = hypot(m1, m2, m3);
    EXPECT_GT(res, m1);
    EXPECT_GT(res, m2);
    EXPECT_GT(res, m3);
    auto res2 = hypot(m3, m1, m2);
    auto res3 = hypot(m2, m3, m1);
    EXPECT_EQ(res, res2);
    EXPECT_EQ(res2, res3);
}